

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O3

void mwheel::
     Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
     ::check_creator(void)

{
  creator_type *pcVar1;
  runtime_error *this;
  stringstream estream;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  pcVar1 = get_creator();
  if ((pcVar1->super__Function_base)._M_manager != (_Manager_type)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"ERROR : in Singleton ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             "N6mwheel9SingletonINS_16PrototypeFactoryINS_4test15ClientInterfaceENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESt10shared_ptrIS3_EEEEE"
             ,0x8e);
  std::endl<char,std::char_traits<char>>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\tcreator not set",0x10);
  std::endl<char,std::char_traits<char>>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             "\tMaybe you forgot to call \"set_creator\" before retrieving the singleton instance?",
             0x51);
  std::endl<char,std::char_traits<char>>(local_190);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  *(undefined ***)this = &PTR__runtime_error_00109c40;
  __cxa_throw(this,&Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
                    ::creator_not_set::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void check_creator() {
    auto &creator = get_creator();
    if (!creator) {
      // Using auto with an std::stringstream is a PITA!
      std::stringstream estream;
      estream << "ERROR : in Singleton " << typeid(Singleton).name() << std::endl;
      estream << "\tcreator not set" << std::endl;
      estream
          << "\tMaybe you forgot to call \"set_creator\" before retrieving the singleton instance?"
          << std::endl;
      throw creator_not_set(estream.str());
    }
  }